

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numbers.h
# Opt level: O2

size_t absl::lts_20250127::numbers_internal::FastHexToBufferZeroPad16
                 (uint64_t val,Nonnull<char_*> out)

{
  long lVar1;
  
  for (lVar1 = 0x38; lVar1 != -8; lVar1 = lVar1 + -8) {
    *(undefined2 *)out = *(undefined2 *)(kHexTable + (val >> ((byte)lVar1 & 0x3f) & 0xff) * 2);
    out = out + 2;
  }
  lVar1 = 0x3f;
  if ((val | 1) != 0) {
    for (; (val | 1) >> lVar1 == 0; lVar1 = lVar1 + -1) {
    }
  }
  return (ulong)(0x10 - (((uint)lVar1 ^ 0x3c) >> 2));
}

Assistant:

inline size_t FastHexToBufferZeroPad16(uint64_t val, absl::Nonnull<char*> out) {
#ifdef ABSL_INTERNAL_HAVE_SSSE3
  uint64_t be = absl::big_endian::FromHost64(val);
  const auto kNibbleMask = _mm_set1_epi8(0xf);
  const auto kHexDigits = _mm_setr_epi8('0', '1', '2', '3', '4', '5', '6', '7',
                                        '8', '9', 'a', 'b', 'c', 'd', 'e', 'f');
  auto v = _mm_loadl_epi64(reinterpret_cast<__m128i*>(&be));  // load lo dword
  auto v4 = _mm_srli_epi64(v, 4);                            // shift 4 right
  auto il = _mm_unpacklo_epi8(v4, v);                        // interleave bytes
  auto m = _mm_and_si128(il, kNibbleMask);                   // mask out nibbles
  auto hexchars = _mm_shuffle_epi8(kHexDigits, m);           // hex chars
  _mm_storeu_si128(reinterpret_cast<__m128i*>(out), hexchars);
#else
  for (int i = 0; i < 8; ++i) {
    auto byte = (val >> (56 - 8 * i)) & 0xFF;
    auto* hex = &absl::numbers_internal::kHexTable[byte * 2];
    std::memcpy(out + 2 * i, hex, 2);
  }
#endif
  // | 0x1 so that even 0 has 1 digit.
  return 16 - static_cast<size_t>(countl_zero(val | 0x1) / 4);
}